

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O3

int testStorageWriterTestsSupportedTypes(void)

{
  pointer pcVar1;
  pointer __s1;
  pointer puVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  allocator_type *__a;
  allocator_type *__a_00;
  allocator_type *__a_01;
  pointer offset;
  uint64_t offset_00;
  uint64_t offset_01;
  uint64_t offset_02;
  SpanSize<18446744073709551615UL> __n;
  long lVar6;
  SpanSize<18446744073709551615UL> SVar7;
  SpanSize<18446744073709551615UL> SVar8;
  SpanSize<18446744073709551615UL> SVar9;
  BlobDataType dataType;
  SpanSize<18446744073709551615UL> in_R8;
  pointer ptVar10;
  pointer ptVar11;
  bool bVar12;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  initializer_list<MILBlob::Fp16> __l_00;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> data_00;
  initializer_list<float> __l_01;
  Span<const_float,_18446744073709551615UL> data_01;
  initializer_list<signed_char> __l_02;
  Span<const_signed_char,_18446744073709551615UL> data_02;
  Span<unsigned_char,_18446744073709551615UL> data_03;
  Span<unsigned_char,_18446744073709551615UL> data_04;
  Span<unsigned_char,_18446744073709551615UL> data_05;
  Span<unsigned_char,_18446744073709551615UL> data_06;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> expectedSpan;
  Span<const_float,_18446744073709551615UL> expectedSpan_00;
  Span<const_signed_char,_18446744073709551615UL> expectedSpan_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  StorageWriter writer;
  string filePath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  AutoDeleteTempFile tempfile;
  allocator_type local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  string local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  AutoDeleteTempFile local_58;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_58);
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_58);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + psVar4->_M_string_length);
  local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x10adde01);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_70,__l,(allocator_type *)&local_e8);
  __n.m_size = (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  ptVar11 = (pointer)0x0;
  if (__n.m_size != 0) {
    ptVar11 = (pointer)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  }
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_58);
  MILBlob::Blob::StorageWriter::StorageWriter((StorageWriter *)&local_d0,psVar4,true);
  data.m_size.m_size = __n.m_size;
  data.m_ptr = (pointer)ptVar11;
  psVar4 = (string *)
           MILBlob::Blob::StorageWriter::WriteData<unsigned_char>((StorageWriter *)&local_d0,data);
  MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&local_d0);
  if (((ulong)psVar4 & 0x3f) == 0) {
    local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x200000000;
    local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    data_03.m_size.m_size = in_R8.m_size;
    data_03.m_ptr = (pointer)0x40;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)&local_90,(string *)0x0,(uint64_t)&local_d0,data_03);
    if (((int)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start != 1) ||
       (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ != 2)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"IsCorrectHeader(filePath, 1 )",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      goto LAB_001c5693;
    }
    local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x2deadbeef;
    data_04.m_size.m_size = in_R8.m_size;
    data_04.m_ptr = (pointer)0x40;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)&local_90,psVar4,(uint64_t)&local_d0,data_04);
    if (((((int)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                super__Vector_impl_data._M_start != -0x21524111) ||
         (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ != 3)) ||
        (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
         super__Vector_impl_data._M_finish != (pointer)0x4)) ||
       (((ulong)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x3f) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8)",0x44)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      goto LAB_001c5693;
    }
    local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x3deadbeef;
    data_05.m_size.m_size = in_R8.m_size;
    data_05.m_ptr = (pointer)0x40;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)&local_90,psVar4,(uint64_t)&local_d0,data_05);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_e8,__n.m_size,&local_e9);
    puVar2 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __s1 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    ptVar10 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    offset = (pointer)0x0;
    if (ptVar10 != (pointer)0x0) {
      offset = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    data_06.m_size.m_size = in_R8.m_size;
    data_06.m_ptr = ptVar10;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)&local_90,
               (string *)
               local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(uint64_t)offset,data_06);
    dataType = (BlobDataType)in_R8.m_size;
    bVar12 = ptVar10 == (pointer)__n.m_size;
    if (bVar12 && puVar2 != __s1) {
      iVar3 = bcmp(__s1,ptVar11,__n.m_size);
      bVar12 = iVar3 == 0;
    }
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"IsCorrectData<uint8_t>(filePath, offset, expectedSpan)",0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      goto LAB_001c5693;
    }
    if ((pointer)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xabcd012400000012;
    __a = (allocator_type *)&local_70;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&local_e8;
    std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector(&local_d0,__l_00,__a);
    lVar6 = (long)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_start;
    ptVar11 = (pointer)0x0;
    if (lVar6 != 0) {
      ptVar11 = local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_58);
    MILBlob::Blob::StorageWriter::StorageWriter((StorageWriter *)&local_e8,psVar4,false);
    SVar7.m_size = lVar6 >> 1;
    data_00.m_size.m_size = SVar7.m_size;
    data_00.m_ptr = ptVar11;
    psVar4 = (string *)
             MILBlob::Blob::StorageWriter::WriteData<MILBlob::Fp16>
                       ((StorageWriter *)&local_e8,data_00);
    MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&local_e8);
    if (((ulong)psVar4 & 0x3f) == 0) {
      bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectHeader(&local_90,2);
      if (bVar12) {
        bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectMetadata<MILBlob::Fp16>
                           ((anon_unknown_dwarf_1bdb1f *)&local_90,psVar4,offset_00,(uint64_t)__a,
                            dataType);
        if (bVar12) {
          expectedSpan.m_size.m_size = SVar7.m_size;
          expectedSpan.m_ptr = ptVar11;
          bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectData<MILBlob::Fp16>
                             (&local_90,(uint64_t)psVar4,expectedSpan);
          if (bVar12) {
            if (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d0.
                              super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d0.
                                    super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d0.
                                    super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x42904e9a4048f5c3;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x40e00000492bcde0;
            __a_00 = (allocator_type *)&local_70;
            __l_01._M_len = 4;
            __l_01._M_array = (iterator)&local_e8;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_d0,__l_01,__a_00);
            lVar6 = (long)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            ptVar11 = (pointer)0x0;
            if (lVar6 != 0) {
              ptVar11 = local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
            psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_58);
            MILBlob::Blob::StorageWriter::StorageWriter((StorageWriter *)&local_e8,psVar4,false);
            SVar8.m_size = lVar6 >> 2;
            data_01.m_size.m_size = SVar8.m_size;
            data_01.m_ptr = (pointer)ptVar11;
            psVar4 = (string *)
                     MILBlob::Blob::StorageWriter::WriteData<float>
                               ((StorageWriter *)&local_e8,data_01);
            MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&local_e8);
            if (((ulong)psVar4 & 0x3f) == 0) {
              bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectHeader(&local_90,3);
              if (bVar12) {
                bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectMetadata<float>
                                   ((anon_unknown_dwarf_1bdb1f *)&local_90,psVar4,offset_01,
                                    (uint64_t)__a_00,dataType);
                if (bVar12) {
                  expectedSpan_00.m_size.m_size = SVar8.m_size;
                  expectedSpan_00.m_ptr = (pointer)ptVar11;
                  bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectData<float>
                                     (&local_90,(uint64_t)psVar4,expectedSpan_00);
                  if (bVar12) {
                    if (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d0.
                                      super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d0.
                                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d0.
                                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_e8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           0xe70aff01);
                    __a_01 = (allocator_type *)&local_70;
                    __l_02._M_len = 4;
                    __l_02._M_array = (iterator)&local_e8;
                    std::vector<signed_char,_std::allocator<signed_char>_>::vector
                              ((vector<signed_char,_std::allocator<signed_char>_> *)&local_d0,__l_02
                               ,__a_01);
                    SVar9.m_size = (long)local_d0.
                                         super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d0.
                                         super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                    ptVar11 = (pointer)0x0;
                    if (SVar9.m_size != 0) {
                      ptVar11 = local_d0.
                                super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    }
                    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                                       (&local_58);
                    MILBlob::Blob::StorageWriter::StorageWriter
                              ((StorageWriter *)&local_e8,psVar4,false);
                    data_02.m_size.m_size = SVar9.m_size;
                    data_02.m_ptr = (pointer)ptVar11;
                    psVar4 = (string *)
                             MILBlob::Blob::StorageWriter::WriteData<signed_char>
                                       ((StorageWriter *)&local_e8,data_02);
                    MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&local_e8);
                    if (((ulong)psVar4 & 0x3f) == 0) {
                      bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectHeader(&local_90,4);
                      if (!bVar12) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                   ,0x7a);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7c);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5,"IsCorrectHeader(filePath, 4 )",0x1d);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," was false, expected true.",0x1a);
                        goto LAB_001c6158;
                      }
                      bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectMetadata<signed_char>
                                         ((anon_unknown_dwarf_1bdb1f *)&local_90,psVar4,offset_02,
                                          (uint64_t)__a_01,dataType);
                      if (!bVar12) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                   ,0x7a);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7d);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5,
                                   "IsCorrectMetadata<int8_t>(filePath, offset, 4, BlobDataType::Int8)"
                                   ,0x42);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," was false, expected true.",0x1a);
                        goto LAB_001c6158;
                      }
                      expectedSpan_01.m_size.m_size = SVar9.m_size;
                      expectedSpan_01.m_ptr = (pointer)ptVar11;
                      bVar12 = anon_unknown.dwarf_1bdb1f::IsCorrectData<signed_char>
                                         (&local_90,(uint64_t)psVar4,expectedSpan_01);
                      iVar3 = 0;
                      if (!bVar12) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                   ,0x7a);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7e);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5,"IsCorrectData<int8_t>(filePath, offset, expectedSpan)",
                                   0x35);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," was false, expected true.",0x1a);
                        goto LAB_001c6158;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                 ,0x7a);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,":",1);
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5,"(offset % DefaultStorageAlignment) == (uint64_t(0))",0x33);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5," was false, expected true.",0x1a);
LAB_001c6158:
                      iVar3 = 1;
                      std::endl<char,std::char_traits<char>>(poVar5);
                    }
                    if (local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d0.
                                      super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d0.
                                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d0.
                                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    goto LAB_001c56c8;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                             ,0x7a);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6e);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,"IsCorrectData<float>(filePath, offset, expectedSpan)",0x34);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5," was false, expected true.",0x1a);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                             ,0x7a);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6d);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,
                             "IsCorrectMetadata<float>(filePath, offset, 4, BlobDataType::Float32)",
                             0x44);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5," was false, expected true.",0x1a);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                           ,0x7a);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"IsCorrectHeader(filePath, 3 )",0x1d);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5," was false, expected true.",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                         ,0x7a);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6b);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"(offset % DefaultStorageAlignment) == (uint64_t(0))",0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," was false, expected true.",0x1a);
            }
            std::endl<char,std::char_traits<char>>(poVar5);
            local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            goto joined_r0x001c5c82;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"IsCorrectData<Fp16>(filePath, offset, expectedSpan)",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," was false, expected true.",0x1a);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16)",
                     0x43);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," was false, expected true.",0x1a);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                   ,0x7a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"IsCorrectHeader(filePath, 2 )",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
      }
      std::endl<char,std::char_traits<char>>(poVar5);
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(offset % DefaultStorageAlignment) == (uint64_t(0))",0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_d0.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"(offset % DefaultStorageAlignment) == (uint64_t(0))",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_001c5693:
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
joined_r0x001c5c82:
  if ((pointer)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar3 = 1;
LAB_001c56c8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_58);
  return iVar3;
}

Assistant:

int testStorageWriterTestsSupportedTypes()
{
    AutoDeleteTempFile tempfile;
    auto filePath = tempfile.GetFilename();

    // Writing uint8_t values
    {
        const std::vector<uint8_t> val = {0x01, 0xde, 0xad, 0x10};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename());
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 1 /*count*/));
        ML_ASSERT(IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8));
        ML_ASSERT(IsCorrectData<uint8_t>(filePath, offset, expectedSpan));
    }

    // Writing fp16 values
    {
        const std::vector<Fp16> val = {Fp16(0x12), Fp16(0x00), Fp16(0x124), Fp16(0xabcd)};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 2 /*count*/));
        ML_ASSERT(IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16));
        ML_ASSERT(IsCorrectData<Fp16>(filePath, offset, expectedSpan));
    }

    // Writing fp32 values
    {
        const std::vector<float> val = {3.14f, 72.1535155f, 0xabcde, 0x007};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 3 /*count*/));
        ML_ASSERT(IsCorrectMetadata<float>(filePath, offset, 4, BlobDataType::Float32));
        ML_ASSERT(IsCorrectData<float>(filePath, offset, expectedSpan));
    }

    // Writing int8 values
    {
        const std::vector<int8_t> val = {1, -1, 10, -25};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 4 /*count*/));
        ML_ASSERT(IsCorrectMetadata<int8_t>(filePath, offset, 4, BlobDataType::Int8));
        ML_ASSERT(IsCorrectData<int8_t>(filePath, offset, expectedSpan));
    }

    return 0;
}